

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void VE4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long in_RDI;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 auVar4 [16];
  int i;
  int vals;
  __m128i avg;
  __m128i b;
  __m128i lsb;
  __m128i a;
  __m128i CDEFGH00;
  __m128i BCDEFGH0;
  __m128i ABCDEFGH;
  __m128i one;
  undefined3 in_stack_fffffffffffffe4c;
  int val;
  int iVar20;
  undefined4 uVar21;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  
  val = CONCAT13(1,in_stack_fffffffffffffe4c);
  uVar1 = *(ulong *)(in_RDI + -0x21);
  local_18 = (undefined1)uVar1;
  uStack_17 = (undefined1)(uVar1 >> 8);
  uStack_16 = (undefined1)(uVar1 >> 0x10);
  uStack_15 = (undefined1)(uVar1 >> 0x18);
  uStack_14 = (undefined1)(uVar1 >> 0x20);
  uStack_13 = (undefined1)(uVar1 >> 0x28);
  uStack_12 = (undefined1)(uVar1 >> 0x30);
  uStack_11 = (undefined1)(uVar1 >> 0x38);
  uVar3 = pavgb(local_18,uStack_16);
  uVar5 = pavgb(uStack_17,uStack_15);
  uVar6 = pavgb(uStack_16,uStack_14);
  uVar7 = pavgb(uStack_15,uStack_13);
  uVar8 = pavgb(uStack_14,uStack_12);
  uVar9 = pavgb(uStack_13,uStack_11);
  uVar10 = pavgb(uStack_12,0);
  uVar11 = pavgb(uStack_11,0);
  uVar12 = pavgb(0,0);
  uVar13 = pavgb(0,0);
  uVar14 = pavgb(0,0);
  uVar15 = pavgb(0,0);
  uVar16 = pavgb(0,0);
  uVar17 = pavgb(0,0);
  uVar18 = pavgb(0,0);
  uVar19 = pavgb(0,0);
  auVar2[1] = uVar5;
  auVar2[0] = uVar3;
  auVar2[2] = uVar6;
  auVar2[3] = uVar7;
  auVar2[4] = uVar8;
  auVar2[5] = uVar9;
  auVar2[6] = uVar10;
  auVar2[7] = uVar11;
  auVar2[9] = uVar13;
  auVar2[8] = uVar12;
  auVar2[10] = uVar14;
  auVar2[0xb] = uVar15;
  auVar2[0xc] = uVar16;
  auVar2[0xd] = uVar17;
  auVar2[0xe] = uVar18;
  auVar2[0xf] = uVar19;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (uVar1 ^ uVar1 >> 0x10) & 0x101010101010101;
  auVar4 = psubusb(auVar2,auVar4);
  local_38 = auVar4[0];
  uStack_37 = auVar4[1];
  uStack_36 = auVar4[2];
  uStack_35 = auVar4[3];
  uStack_34 = auVar4[4];
  uStack_33 = auVar4[5];
  uStack_32 = auVar4[6];
  uStack_31 = auVar4[7];
  uStack_30 = auVar4[8];
  uStack_2f = auVar4[9];
  uStack_2e = auVar4[10];
  uStack_2d = auVar4[0xb];
  uStack_2c = auVar4[0xc];
  uStack_2b = auVar4[0xd];
  uStack_2a = auVar4[0xe];
  uStack_29 = auVar4[0xf];
  uVar3 = pavgb(local_38,uStack_17);
  uVar5 = pavgb(uStack_37,uStack_16);
  uVar6 = pavgb(uStack_36,uStack_15);
  uVar7 = pavgb(uStack_35,uStack_14);
  pavgb(uStack_34,uStack_13);
  pavgb(uStack_33,uStack_12);
  pavgb(uStack_32,uStack_11);
  pavgb(uStack_31,0);
  pavgb(uStack_30,0);
  pavgb(uStack_2f,0);
  pavgb(uStack_2e,0);
  pavgb(uStack_2d,0);
  pavgb(uStack_2c,0);
  pavgb(uStack_2b,0);
  pavgb(uStack_2a,0);
  pavgb(uStack_29,0);
  uVar21 = CONCAT13(uVar7,CONCAT12(uVar6,CONCAT11(uVar5,uVar3)));
  for (iVar20 = 0; iVar20 < 4; iVar20 = iVar20 + 1) {
    WebPInt32ToMem((uint8_t *)CONCAT44(uVar21,iVar20),val);
  }
  return;
}

Assistant:

static void VE4_SSE2(uint8_t* dst) {    // vertical
  const __m128i one = _mm_set1_epi8(1);
  const __m128i ABCDEFGH = _mm_loadl_epi64((__m128i*)(dst - BPS - 1));
  const __m128i BCDEFGH0 = _mm_srli_si128(ABCDEFGH, 1);
  const __m128i CDEFGH00 = _mm_srli_si128(ABCDEFGH, 2);
  const __m128i a = _mm_avg_epu8(ABCDEFGH, CDEFGH00);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(ABCDEFGH, CDEFGH00), one);
  const __m128i b = _mm_subs_epu8(a, lsb);
  const __m128i avg = _mm_avg_epu8(b, BCDEFGH0);
  const int vals = _mm_cvtsi128_si32(avg);
  int i;
  for (i = 0; i < 4; ++i) {
    WebPInt32ToMem(dst + i * BPS, vals);
  }
}